

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * Cloud_GetOneCube(CloudManager *dd,CloudNode *bFunc)

{
  CloudNode *pCVar1;
  CloudManager *local_38;
  CloudNode *res;
  CloudNode *bFunc1;
  CloudNode *bFunc0;
  CloudNode *bFunc_local;
  CloudManager *dd_local;
  
  dd_local = (CloudManager *)bFunc;
  if ((*(uint *)(((ulong)bFunc & 0xfffffffffffffffe) + 4) & 0xefffffff) != 0xfffffff) {
    if (((ulong)bFunc & 1) == 0) {
      bFunc1 = bFunc->e;
      res = bFunc->t;
    }
    else {
      bFunc1 = (CloudNode *)((ulong)bFunc->e ^ 1);
      res = (CloudNode *)((ulong)bFunc->t ^ 1);
    }
    pCVar1 = Cloud_GetOneCube(dd,bFunc1);
    if (pCVar1 == (CloudNode *)0x0) {
      dd_local = (CloudManager *)0x0;
    }
    else {
      if (pCVar1 == dd->zero) {
        pCVar1 = Cloud_GetOneCube(dd,res);
        if (pCVar1 == (CloudNode *)0x0) {
          return (CloudNode *)0x0;
        }
        if (pCVar1 == dd->zero) {
          __assert_fail("res != dd->zero",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                        ,0x353,"CloudNode *Cloud_GetOneCube(CloudManager *, CloudNode *)");
        }
        local_38 = (CloudManager *)
                   Cloud_bddAnd(dd,pCVar1,
                                dd->vars[*(uint *)(((ulong)bFunc & 0xfffffffffffffffe) + 4)]);
      }
      else {
        local_38 = (CloudManager *)
                   Cloud_bddAnd(dd,pCVar1,
                                (CloudNode *)
                                ((ulong)dd->vars[*(uint *)(((ulong)bFunc & 0xfffffffffffffffe) + 4)]
                                ^ 1));
      }
      dd_local = local_38;
    }
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * Cloud_GetOneCube( CloudManager * dd, CloudNode * bFunc )
{
    CloudNode * bFunc0, * bFunc1, * res;

    if ( Cloud_IsConstant(bFunc) )
        return bFunc;

    // cofactor
    if ( Cloud_IsComplement(bFunc) )
    {
        bFunc0 = Cloud_Not( cloudE(bFunc) );
        bFunc1 = Cloud_Not( cloudT(bFunc) );
    }
    else
    {
        bFunc0 = cloudE(bFunc);
        bFunc1 = cloudT(bFunc);
    }

    // try to find the cube with the negative literal
    res = Cloud_GetOneCube( dd, bFunc0 );
    if ( res == NULL )
        return NULL;

    if ( res != dd->zero )
    {
        res = Cloud_bddAnd( dd, res, Cloud_Not(dd->vars[Cloud_V(bFunc)]) );
    }
    else
    {
        // try to find the cube with the positive literal
        res = Cloud_GetOneCube( dd, bFunc1 );
        if ( res == NULL )
            return NULL;
        assert( res != dd->zero );
        res = Cloud_bddAnd( dd, res, dd->vars[Cloud_V(bFunc)] );
    }
    return res;
}